

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopAddOr(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  WhereInfo *pWVar5;
  WhereClause *pWVar6;
  WhereTerm *pWVar7;
  WhereLoop *pTemplate;
  SrcList *pSVar8;
  WhereOrInfo *pWVar9;
  WhereTerm *pWVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  WhereOrCost *pWVar14;
  LogEst rRun;
  LogEst nOut;
  undefined1 local_380 [8];
  WhereOrSet sPrev;
  int local_340;
  int j;
  int i;
  int once;
  WhereTerm *pOrTerm;
  WhereTerm *pOrWCEnd;
  WhereClause *pOrWC;
  SrcList_item *pItem;
  WhereOrSet sCur;
  WhereOrSet sSum;
  WhereLoopBuilder sSubBuild;
  WhereClause tempWC;
  int iCur;
  int rc;
  WhereTerm *pWCEnd;
  WhereTerm *pTerm;
  WhereLoop *pNew;
  WhereClause *pWC;
  WhereInfo *pWInfo;
  Bitmask mUnusable_local;
  Bitmask mPrereq_local;
  WhereLoopBuilder *pBuilder_local;
  
  pWVar5 = pBuilder->pWInfo;
  tempWC.aStatic[7].prereqAll._4_4_ = 0;
  pWVar6 = pBuilder->pWC;
  pWVar7 = pWVar6->a;
  iVar2 = pWVar6->nTerm;
  pTemplate = pBuilder->pNew;
  memset(&sCur.a[2].rRun,0,0x38);
  pSVar8 = pWVar5->pTabList;
  bVar1 = pTemplate->iTab;
  iVar3 = pSVar8->a[(int)(uint)bVar1].iCursor;
  pWCEnd = pWVar6->a;
  do {
    if (pWVar7 + iVar2 <= pWCEnd || tempWC.aStatic[7].prereqAll._4_4_ != 0) {
      return tempWC.aStatic[7].prereqAll._4_4_;
    }
    if (((pWCEnd->eOperator & 0x200) != 0) &&
       ((((pWCEnd->u).pOrInfo)->indexable & pTemplate->maskSelf) != 0)) {
      pWVar9 = (pWCEnd->u).pOrInfo;
      pWVar10 = (pWVar9->wc).a;
      iVar4 = (pWVar9->wc).nTerm;
      bVar13 = true;
      memcpy(&sSum.a[2].rRun,pBuilder,0x30);
      sSubBuild.pWC = (WhereClause *)0x0;
      sSubBuild.pNew = (WhereLoop *)&pItem;
      for (_i = (pWVar9->wc).a; _i < pWVar10 + iVar4; _i = _i + 1) {
        if ((_i->eOperator & 0x400) == 0) {
          if (_i->leftCursor == iVar3) {
            sSubBuild._40_8_ = pWVar6->pWInfo;
            sSubBuild.pWInfo = (WhereInfo *)&sSubBuild.bldFlags;
            goto LAB_001a286a;
          }
        }
        else {
          sSubBuild.pWInfo = (WhereInfo *)(_i->u).pOrInfo;
LAB_001a286a:
          pItem._0_2_ = 0;
          if ((pSVar8->a[(int)(uint)bVar1].pTab)->nModuleArg == 0) {
            tempWC.aStatic[7].prereqAll._4_4_ =
                 whereLoopAddBtree((WhereLoopBuilder *)&sSum.a[2].rRun,mPrereq);
          }
          else {
            tempWC.aStatic[7].prereqAll._4_4_ =
                 whereLoopAddVirtual((WhereLoopBuilder *)&sSum.a[2].rRun,mPrereq,mUnusable);
          }
          if (tempWC.aStatic[7].prereqAll._4_4_ == 0) {
            tempWC.aStatic[7].prereqAll._4_4_ =
                 whereLoopAddOr((WhereLoopBuilder *)&sSum.a[2].rRun,mPrereq,mUnusable);
          }
          if ((ushort)pItem == 0) {
            sCur.a[2].rRun = 0;
            break;
          }
          if (bVar13) {
            whereOrMove((WhereOrSet *)&sCur.a[2].rRun,(WhereOrSet *)&pItem);
            bVar13 = false;
          }
          else {
            whereOrMove((WhereOrSet *)local_380,(WhereOrSet *)&sCur.a[2].rRun);
            sCur.a[2].rRun = 0;
            for (local_340 = 0; local_340 < (int)(uint)(ushort)local_380._0_2_;
                local_340 = local_340 + 1) {
              for (sPrev.a[2]._12_4_ = 0; (int)sPrev.a[2]._12_4_ < (int)(uint)(ushort)pItem;
                  sPrev.a[2]._12_4_ = sPrev.a[2]._12_4_ + 1) {
                pWVar14 = sPrev.a + (long)local_340 + -1;
                uVar11._0_2_ = pWVar14->rRun;
                uVar11._2_2_ = pWVar14->nOut;
                uVar11._4_4_ = *(undefined4 *)&pWVar14->field_0xc;
                pWVar14 = sCur.a + (long)(int)sPrev.a[2]._12_4_ + -1;
                uVar12._0_2_ = pWVar14->rRun;
                uVar12._2_2_ = pWVar14->nOut;
                uVar12._4_4_ = *(undefined4 *)&pWVar14->field_0xc;
                rRun = sqlite3LogEstAdd((LogEst)sPrev.a[local_340].prereq,
                                        (LogEst)sCur.a[(int)sPrev.a[2]._12_4_].prereq);
                nOut = sqlite3LogEstAdd(*(LogEst *)((long)&sPrev.a[local_340].prereq + 2),
                                        *(LogEst *)
                                         ((long)&sCur.a[(int)sPrev.a[2]._12_4_].prereq + 2));
                whereOrInsert((WhereOrSet *)&sCur.a[2].rRun,uVar11 | uVar12,rRun,nOut);
              }
            }
          }
        }
      }
      pTemplate->nLTerm = 1;
      *pTemplate->aLTerm = pWCEnd;
      pTemplate->wsFlags = 0x2000;
      pTemplate->rSetup = 0;
      pTemplate->iSortIdx = '\0';
      memset(&pTemplate->u,0,0x10);
      for (local_340 = 0;
          tempWC.aStatic[7].prereqAll._4_4_ == 0 && local_340 < (int)(uint)(ushort)sCur.a[2].rRun;
          local_340 = local_340 + 1) {
        pTemplate->rRun = (short)sSum.a[local_340].prereq + 1;
        pTemplate->nOut = *(LogEst *)((long)&sSum.a[local_340].prereq + 2);
        pTemplate->prereq = *(Bitmask *)&sSum.a[(long)local_340 + -1].rRun;
        tempWC.aStatic[7].prereqAll._4_4_ = whereLoopInsert(pBuilder,pTemplate);
      }
    }
    pWCEnd = pWCEnd + 1;
  } while( true );
}

Assistant:

static int whereLoopAddOr(
  WhereLoopBuilder *pBuilder, 
  Bitmask mPrereq, 
  Bitmask mUnusable
){
  WhereInfo *pWInfo = pBuilder->pWInfo;
  WhereClause *pWC;
  WhereLoop *pNew;
  WhereTerm *pTerm, *pWCEnd;
  int rc = SQLITE_OK;
  int iCur;
  WhereClause tempWC;
  WhereLoopBuilder sSubBuild;
  WhereOrSet sSum, sCur;
  struct SrcList_item *pItem;
  
  pWC = pBuilder->pWC;
  pWCEnd = pWC->a + pWC->nTerm;
  pNew = pBuilder->pNew;
  memset(&sSum, 0, sizeof(sSum));
  pItem = pWInfo->pTabList->a + pNew->iTab;
  iCur = pItem->iCursor;

  for(pTerm=pWC->a; pTerm<pWCEnd && rc==SQLITE_OK; pTerm++){
    if( (pTerm->eOperator & WO_OR)!=0
     && (pTerm->u.pOrInfo->indexable & pNew->maskSelf)!=0 
    ){
      WhereClause * const pOrWC = &pTerm->u.pOrInfo->wc;
      WhereTerm * const pOrWCEnd = &pOrWC->a[pOrWC->nTerm];
      WhereTerm *pOrTerm;
      int once = 1;
      int i, j;
    
      sSubBuild = *pBuilder;
      sSubBuild.pOrderBy = 0;
      sSubBuild.pOrSet = &sCur;

      WHERETRACE(0x200, ("Begin processing OR-clause %p\n", pTerm));
      for(pOrTerm=pOrWC->a; pOrTerm<pOrWCEnd; pOrTerm++){
        if( (pOrTerm->eOperator & WO_AND)!=0 ){
          sSubBuild.pWC = &pOrTerm->u.pAndInfo->wc;
        }else if( pOrTerm->leftCursor==iCur ){
          tempWC.pWInfo = pWC->pWInfo;
          tempWC.pOuter = pWC;
          tempWC.op = TK_AND;
          tempWC.nTerm = 1;
          tempWC.a = pOrTerm;
          sSubBuild.pWC = &tempWC;
        }else{
          continue;
        }
        sCur.n = 0;
#ifdef WHERETRACE_ENABLED
        WHERETRACE(0x200, ("OR-term %d of %p has %d subterms:\n", 
                   (int)(pOrTerm-pOrWC->a), pTerm, sSubBuild.pWC->nTerm));
        if( sqlite3WhereTrace & 0x400 ){
          sqlite3WhereClausePrint(sSubBuild.pWC);
        }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
        if( IsVirtual(pItem->pTab) ){
          rc = whereLoopAddVirtual(&sSubBuild, mPrereq, mUnusable);
        }else
#endif
        {
          rc = whereLoopAddBtree(&sSubBuild, mPrereq);
        }
        if( rc==SQLITE_OK ){
          rc = whereLoopAddOr(&sSubBuild, mPrereq, mUnusable);
        }
        assert( rc==SQLITE_OK || sCur.n==0 );
        if( sCur.n==0 ){
          sSum.n = 0;
          break;
        }else if( once ){
          whereOrMove(&sSum, &sCur);
          once = 0;
        }else{
          WhereOrSet sPrev;
          whereOrMove(&sPrev, &sSum);
          sSum.n = 0;
          for(i=0; i<sPrev.n; i++){
            for(j=0; j<sCur.n; j++){
              whereOrInsert(&sSum, sPrev.a[i].prereq | sCur.a[j].prereq,
                            sqlite3LogEstAdd(sPrev.a[i].rRun, sCur.a[j].rRun),
                            sqlite3LogEstAdd(sPrev.a[i].nOut, sCur.a[j].nOut));
            }
          }
        }
      }
      pNew->nLTerm = 1;
      pNew->aLTerm[0] = pTerm;
      pNew->wsFlags = WHERE_MULTI_OR;
      pNew->rSetup = 0;
      pNew->iSortIdx = 0;
      memset(&pNew->u, 0, sizeof(pNew->u));
      for(i=0; rc==SQLITE_OK && i<sSum.n; i++){
        /* TUNING: Currently sSum.a[i].rRun is set to the sum of the costs
        ** of all sub-scans required by the OR-scan. However, due to rounding
        ** errors, it may be that the cost of the OR-scan is equal to its
        ** most expensive sub-scan. Add the smallest possible penalty 
        ** (equivalent to multiplying the cost by 1.07) to ensure that 
        ** this does not happen. Otherwise, for WHERE clauses such as the
        ** following where there is an index on "y":
        **
        **     WHERE likelihood(x=?, 0.99) OR y=?
        **
        ** the planner may elect to "OR" together a full-table scan and an
        ** index lookup. And other similarly odd results.  */
        pNew->rRun = sSum.a[i].rRun + 1;
        pNew->nOut = sSum.a[i].nOut;
        pNew->prereq = sSum.a[i].prereq;
        rc = whereLoopInsert(pBuilder, pNew);
      }
      WHERETRACE(0x200, ("End processing OR-clause %p\n", pTerm));
    }
  }
  return rc;
}